

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O0

llama_batch * llama_batch_init(int32_t n_tokens_alloc,int32_t embd,int32_t n_seq_max)

{
  float *pfVar1;
  llama_token *plVar2;
  llama_pos *plVar3;
  int32_t *piVar4;
  llama_seq_id **pplVar5;
  llama_seq_id *plVar6;
  int8_t *piVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  llama_batch *in_RDI;
  int i;
  int local_10;
  
  memset(in_RDI,0,0x38);
  if (in_EDX == 0) {
    plVar2 = (llama_token *)malloc((long)in_ESI << 2);
    in_RDI->token = plVar2;
  }
  else {
    pfVar1 = (float *)malloc((long)in_ESI * 4 * (long)in_EDX);
    in_RDI->embd = pfVar1;
  }
  plVar3 = (llama_pos *)malloc((long)in_ESI << 2);
  in_RDI->pos = plVar3;
  piVar4 = (int32_t *)malloc((long)in_ESI << 2);
  in_RDI->n_seq_id = piVar4;
  pplVar5 = (llama_seq_id **)malloc((long)(in_ESI + 1) << 3);
  in_RDI->seq_id = pplVar5;
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    plVar6 = (llama_seq_id *)malloc((long)in_ECX << 2);
    in_RDI->seq_id[local_10] = plVar6;
  }
  in_RDI->seq_id[in_ESI] = (llama_seq_id *)0x0;
  piVar7 = (int8_t *)malloc((long)in_ESI);
  in_RDI->logits = piVar7;
  return in_RDI;
}

Assistant:

struct llama_batch llama_batch_init(int32_t n_tokens_alloc, int32_t embd, int32_t n_seq_max) {
    llama_batch batch = {
        /*n_tokens       =*/ 0,
        /*tokens         =*/ nullptr,
        /*embd           =*/ nullptr,
        /*pos            =*/ nullptr,
        /*n_seq_id       =*/ nullptr,
        /*seq_id         =*/ nullptr,
        /*logits         =*/ nullptr,
    };

    if (embd) {
        batch.embd = (float *) malloc(sizeof(float) * n_tokens_alloc * embd);
    } else {
        batch.token = (llama_token *) malloc(sizeof(llama_token) * n_tokens_alloc);
    }

    batch.pos      = (llama_pos *)     malloc(sizeof(llama_pos)      * n_tokens_alloc);
    batch.n_seq_id = (int32_t *)       malloc(sizeof(int32_t)        * n_tokens_alloc);
    batch.seq_id   = (llama_seq_id **) malloc(sizeof(llama_seq_id *) * (n_tokens_alloc + 1));
    for (int i = 0; i < n_tokens_alloc; ++i) {
        batch.seq_id[i] = (llama_seq_id *) malloc(sizeof(llama_seq_id) * n_seq_max);
    }
    batch.seq_id[n_tokens_alloc] = nullptr;

    batch.logits   = (int8_t *)        malloc(sizeof(int8_t)         * n_tokens_alloc);

    return batch;
}